

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

float __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<float>::genRandom
          (DefaultSampling<float> *this,FloatFormat *format,Precision param_2,Random *rnd)

{
  int iVar1;
  double dVar2;
  double dVar3;
  deUint32 dVar4;
  deUint64 dVar5;
  uint uVar6;
  int iVar7;
  int __exponent;
  float fVar8;
  float fVar9;
  double dVar10;
  
  iVar7 = format->m_minExp;
  dVar10 = 0.0;
  if (format->m_hasSubnormal != NO) {
    dVar10 = 1.0;
  }
  iVar1 = format->m_maxExp;
  dVar10 = deCbrt(((double)iVar7 + -0.5) - dVar10);
  dVar2 = deCbrt((double)iVar1 + 0.5);
  iVar1 = format->m_fractionBits;
  dVar3 = deRandom_getDouble(&rnd->m_rnd);
  dVar10 = pow(dVar3 * (dVar2 - dVar10) + dVar10,3.0);
  dVar10 = deRoundEven(dVar10);
  dVar4 = deRandom_getUint32(&rnd->m_rnd);
  if ((uint)((ulong)dVar4 % 0x41) < 4) {
    fVar8 = *(float *)(&DAT_00865240 + ((ulong)dVar4 % 0x41) * 4);
  }
  else {
    __exponent = (int)dVar10;
    fVar8 = 0.0;
    if (iVar7 <= __exponent) {
      fVar8 = ldexpf(1.0,__exponent);
      iVar7 = __exponent;
    }
    fVar9 = ldexpf(1.0,iVar7 - iVar1);
    dVar4 = deRandom_getUint32(&rnd->m_rnd);
    uVar6 = dVar4 % 0x11;
    if (uVar6 == 2) {
      fVar9 = 0.0;
    }
    else if (uVar6 != 1) {
      if (uVar6 == 0) {
        fVar9 = fVar8 - fVar9;
      }
      else {
        dVar5 = de::Random::getUint64(rnd);
        fVar9 = fVar9 * (float)(int)((uint)dVar5 & ~(-1 << ((byte)iVar1 & 0x1f)));
      }
    }
    dVar4 = deRandom_getUint32(&rnd->m_rnd);
    fVar8 = fVar8 + fVar9;
    if ((dVar4 & 3) == 0) {
      fVar8 = -fVar8;
    }
  }
  return fVar8;
}

Assistant:

float DefaultSampling<float>::genRandom (const FloatFormat& format,
										 Precision,
										 Random&			rnd) const
{
	const int		minExp			= format.getMinExp();
	const int		maxExp			= format.getMaxExp();
	const bool		haveSubnormal	= format.hasSubnormal() != tcu::NO;

	// Choose exponent so that the cumulative distribution is cubic.
	// This makes the probability distribution quadratic, with the peak centered on zero.
	const double	minRoot			= deCbrt(minExp - 0.5 - (haveSubnormal ? 1.0 : 0.0));
	const double	maxRoot			= deCbrt(maxExp + 0.5);
	const int		fractionBits	= format.getFractionBits();
	const int		exp				= int(deRoundEven(dePow(rnd.getDouble(minRoot, maxRoot),
															3.0)));
	float			base			= 0.0f; // integral power of two
	float			quantum			= 0.0f; // smallest representable difference in the binade
	float			significand		= 0.0f; // Significand.

	DE_ASSERT(fractionBits < std::numeric_limits<float>::digits);

	// Generate some occasional special numbers
	switch (rnd.getInt(0, 64))
	{
		case 0:		return 0;
		case 1:		return TCU_INFINITY;
		case 2:		return -TCU_INFINITY;
		case 3:		return TCU_NAN;
		default:	break;
	}

	if (exp >= minExp)
	{
		// Normal number
		base = deFloatLdExp(1.0f, exp);
		quantum = deFloatLdExp(1.0f, exp - fractionBits);
	}
	else
	{
		// Subnormal
		base = 0.0f;
		quantum = deFloatLdExp(1.0f, minExp - fractionBits);
	}

	switch (rnd.getInt(0, 16))
	{
		case 0: // The highest number in this binade, significand is all bits one.
			significand = base - quantum;
			break;
		case 1: // Significand is one.
			significand = quantum;
			break;
		case 2: // Significand is zero.
			significand = 0.0;
			break;
		default: // Random (evenly distributed) significand.
		{
			deUint64 intFraction = rnd.getUint64() & ((1 << fractionBits) - 1);
			significand = float(intFraction) * quantum;
		}
	}

	// Produce positive numbers more often than negative.
	return (rnd.getInt(0,3) == 0 ? -1.0f : 1.0f) * (base + significand);
}